

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall FIX::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  uint *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  bVar3 = IsClamped(this);
  if (!bVar3) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd4,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  bVar3 = IsClamped(other);
  if (!bVar3) {
    __assert_fail("other.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd5,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  iVar4 = Compare(other,this);
  if (0 < iVar4) {
    __assert_fail("LessEqual(other, *this)",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0xd7,"void FIX::double_conversion::Bignum::SubtractBignum(const Bignum &)");
  }
  Align(this,other);
  if (0 < other->used_digits_) {
    uVar5 = other->exponent_ - this->exponent_;
    puVar1 = (other->bigits_).start_;
    uVar6 = (ulong)uVar5;
    puVar2 = (this->bigits_).start_;
    lVar7 = 0;
    iVar4 = 0;
    do {
      iVar8 = uVar5 + (int)lVar7;
      if (((iVar8 < 0) || ((this->bigits_).length_ <= iVar8)) || ((other->bigits_).length_ <= lVar7)
         ) goto LAB_0016ae90;
      uVar9 = (iVar4 + puVar2[uVar6 + lVar7]) - puVar1[lVar7];
      puVar2[uVar6 + lVar7] = uVar9 & 0xfffffff;
      iVar4 = (int)uVar9 >> 0x1f;
      lVar7 = lVar7 + 1;
    } while (lVar7 < other->used_digits_);
    if ((int)uVar9 < 0) {
      uVar6 = uVar6 + lVar7;
      puVar1 = (this->bigits_).start_;
      do {
        iVar4 = (int)uVar6;
        if ((iVar4 < 0) || ((this->bigits_).length_ <= iVar4)) {
LAB_0016ae90:
          __assert_fail("0 <= index && index < length_",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                        ,0xcc,
                        "T &FIX::double_conversion::Vector<unsigned int>::operator[](int) const [T = unsigned int]"
                       );
        }
        uVar5 = puVar1[uVar6 & 0xffffffff] - 1;
        puVar1[uVar6 & 0xffffffff] = uVar5 & 0xfffffff;
        uVar6 = (ulong)(iVar4 + 1);
      } while ((int)uVar5 < 0);
    }
  }
  Clamp(this);
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}